

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall
icu_63::double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  
  if (factor < 3) {
    iVar4 = 0;
    if (0 < factor) {
      iVar4 = factor;
    }
    while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
      SubtractBignum(this,other);
    }
  }
  else {
    iVar4 = other->exponent_ - this->exponent_;
    puVar1 = (this->bigits_).start_;
    puVar2 = (other->bigits_).start_;
    uVar6 = 0;
    for (lVar5 = 0; lVar5 < other->used_digits_; lVar5 = lVar5 + 1) {
      uVar3 = (ulong)uVar6 + (ulong)puVar2[lVar5] * (ulong)(uint)factor;
      uVar6 = puVar1[iVar4 + lVar5] - ((uint)uVar3 & 0xfffffff);
      puVar1[iVar4 + lVar5] = uVar6 & 0xfffffff;
      uVar6 = (int)(uVar3 >> 0x1c) - ((int)uVar6 >> 0x1f);
    }
    puVar1 = (this->bigits_).start_;
    lVar5 = (long)(other->used_digits_ + iVar4);
    while( true ) {
      if (this->used_digits_ <= lVar5) {
        Clamp(this);
        return;
      }
      if (uVar6 == 0) break;
      uVar6 = puVar1[lVar5] - uVar6;
      puVar1[lVar5] = uVar6 & 0xfffffff;
      uVar6 = uVar6 >> 0x1f;
      lVar5 = lVar5 + 1;
    }
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, int factor) {
  ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * other.bigits_[i];
    DoubleChunk remove = borrow + product;
    Chunk difference = bigits_[i + exponent_diff] - (remove & kBigitMask);
    bigits_[i + exponent_diff] = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_digits_ + exponent_diff; i < used_digits_; ++i) {
    if (borrow == 0) return;
    Chunk difference = bigits_[i] - borrow;
    bigits_[i] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}